

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_blck
          (Parser *this,csubstr currscalar,csubstr peeked_line,size_t indentation)

{
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr chars_00;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  char *in_RCX;
  size_t in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t in_R8;
  char *in_R9;
  basic_substring<char> bVar4;
  substr sVar5;
  char msg_3 [44];
  Parser *in_stack_00000130;
  csubstr in_stack_00000138;
  size_t token_pos;
  csubstr next_peeked;
  char msg_2 [58];
  size_t offs;
  char msg_1 [50];
  char msg [43];
  substr full;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  Parser *in_stack_fffffffffffffc88;
  Location *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  undefined1 *puVar6;
  size_t in_stack_fffffffffffffca0;
  code *pcVar7;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  basic_substring<const_char> *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  undefined1 *in_stack_fffffffffffffcc8;
  code *in_stack_fffffffffffffcd0;
  Parser *in_stack_fffffffffffffcd8;
  code *in_stack_fffffffffffffce0;
  undefined1 *in_stack_fffffffffffffce8;
  bool local_302;
  bool local_301;
  basic_substring<char_const> local_2f0 [40];
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  Parser *in_stack_fffffffffffffd50;
  undefined1 local_2a8 [48];
  basic_substring<char_const> local_278 [16];
  basic_substring<char_const> local_268 [16];
  basic_substring<char_const> local_258 [16];
  basic_substring<char_const> local_248 [16];
  basic_substring<char_const> local_238 [16];
  size_t local_228;
  csubstr local_220;
  basic_substring<char_const> local_210 [16];
  basic_substring<const_char> local_200;
  basic_substring<char_const> local_1f0 [16];
  basic_substring<char_const> local_1e0 [24];
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  Parser *local_1b0;
  undefined1 local_1a8 [64];
  ulong local_168;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  Parser *local_140;
  undefined1 local_138 [232];
  long *local_50;
  ulong *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  csubstr *local_30;
  basic_substring<const_char> *local_28;
  ulong *local_20;
  bool local_1;
  
  local_20 = (ulong *)(in_RDI + 0x18);
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_302 = false;
    if ((in_RDX == 0) && (local_302 = false, in_RSI == *local_20)) {
      local_302 = *local_20 != 0;
    }
    local_1 = local_302;
  }
  else {
    local_301 = false;
    if (*local_20 <= in_RSI) {
      local_301 = in_RSI + in_RDX <= *local_20 + *(long *)(in_RDI + 0x20);
    }
    local_1 = local_301;
  }
  local_138._160_8_ = in_R9;
  local_138._176_8_ = in_RCX;
  local_138._184_8_ = in_R8;
  local_138._192_8_ = in_RSI;
  local_138._200_8_ = in_RDX;
  if (local_1 == false) {
    memcpy(local_138 + 0x60,"check failed: (m_buf.is_super(currscalar))",0x2b);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    pcVar7 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffce8 = local_138 + 0x60;
    Location::Location(in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    (*pcVar7)(in_stack_fffffffffffffce8,0x2b,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc6c = local_138._60_4_;
    in_stack_fffffffffffffc70 = local_138._64_4_;
    in_stack_fffffffffffffc74 = local_138._68_4_;
    in_stack_fffffffffffffc78 = local_138._72_4_;
    in_stack_fffffffffffffc7c = local_138._76_4_;
    in_stack_fffffffffffffc80 = local_138._80_4_;
    in_stack_fffffffffffffc84 = local_138._84_4_;
    in_stack_fffffffffffffc88 = (Parser *)local_138._88_8_;
  }
  local_38 = local_138 + 0xc0;
  local_48 = (ulong *)(in_RDI + 0x18);
  if ((ulong)(local_138._192_8_ + local_138._200_8_) < *local_48) {
    memcpy(local_138,"check failed: (currscalar.end() >= m_buf.begin())",0x32);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    in_stack_fffffffffffffce0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffcd8 = (Parser *)local_138;
    Location::Location(in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    (*in_stack_fffffffffffffce0)(in_stack_fffffffffffffcd8,0x32,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc6c = uStack_15c;
    in_stack_fffffffffffffc70 = uStack_158;
    in_stack_fffffffffffffc74 = uStack_154;
    in_stack_fffffffffffffc78 = local_150;
    in_stack_fffffffffffffc7c = uStack_14c;
    in_stack_fffffffffffffc80 = uStack_148;
    in_stack_fffffffffffffc84 = uStack_144;
    in_stack_fffffffffffffc88 = local_140;
  }
  local_40 = local_138 + 0xc0;
  local_50 = (long *)(in_RDI + 0x18);
  local_168 = (local_138._192_8_ + local_138._200_8_) - *local_50;
  bVar1 = basic_substring<const_char>::begins_with
                    ((basic_substring<const_char> *)(local_138 + 0xb0),' ',local_138._160_8_);
  if (!bVar1) {
    memcpy(local_1a8,"check failed: (peeked_line.begins_with(\' \', indentation))",0x3a);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    in_stack_fffffffffffffcd0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffcc8 = local_1a8;
    Location::Location(in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    (*in_stack_fffffffffffffcd0)(in_stack_fffffffffffffcc8,0x3a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc6c = local_1e0._20_4_;
    in_stack_fffffffffffffc70 = uStack_1c8;
    in_stack_fffffffffffffc74 = uStack_1c4;
    in_stack_fffffffffffffc78 = local_1c0;
    in_stack_fffffffffffffc7c = uStack_1bc;
    in_stack_fffffffffffffc80 = uStack_1b8;
    in_stack_fffffffffffffc84 = uStack_1b4;
    in_stack_fffffffffffffc88 = local_1b0;
  }
  do {
    basic_substring<char_const>::basic_substring<4ul>(local_1e0,(char (*) [4])0x341720);
    pattern.len = (size_t)in_stack_fffffffffffffc98;
    pattern.str = (char *)in_stack_fffffffffffffc90;
    bVar1 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)in_stack_fffffffffffffc88,pattern);
    if (bVar1) {
LAB_003174dd:
      if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) < local_168) {
        memcpy(local_2a8,"check failed: (m_state->pos.offset >= offs)",0x2c);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar7 = *(code **)(in_RDI + 0x9e8);
        puVar6 = local_2a8;
        sVar3 = CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80);
        in_stack_fffffffffffffc80 = in_stack_fffffffffffffd48;
        in_stack_fffffffffffffc84 = in_stack_fffffffffffffd4c;
        Location::Location(in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,sVar3,
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        in_stack_fffffffffffffc88 = in_stack_fffffffffffffd50;
        (*pcVar7)(puVar6,0x2c,*(undefined8 *)(in_RDI + 0x9d0));
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)(local_138 + 0xd0),(char *)in_stack_fffffffffffffc88,
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      basic_substring<char_const>::basic_substring<4ul>(local_2f0,(char (*) [4])"\r\n ");
      chars_00.len = (size_t)in_stack_fffffffffffffce8;
      chars_00.str = (char *)in_stack_fffffffffffffce0;
      bVar4 = basic_substring<char>::trimr
                        ((basic_substring<char> *)in_stack_fffffffffffffcd8,chars_00);
      sVar5.str = bVar4.str;
      sVar5.len = bVar4.len;
      return sVar5;
    }
    basic_substring<char_const>::basic_substring<4ul>(local_1f0,(char (*) [4])"---");
    pattern_00.len = (size_t)in_stack_fffffffffffffc98;
    pattern_00.str = (char *)in_stack_fffffffffffffc90;
    bVar1 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)in_stack_fffffffffffffc88,pattern_00);
    if (bVar1) goto LAB_003174dd;
    bVar1 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)(local_138 + 0xb0),' ',local_138._160_8_);
    if (!bVar1) {
      basic_substring<char_const>::basic_substring<5ul>(local_210,(char (*) [5])" \r\n\t");
      chars.len = in_stack_fffffffffffffca0;
      chars.str = in_stack_fffffffffffffc98;
      local_200 = basic_substring<const_char>::trim
                            ((basic_substring<const_char> *)in_stack_fffffffffffffc90,chars);
      in_stack_fffffffffffffcb8 = &local_200;
      in_stack_fffffffffffffcc7 = true;
      if (local_200.len != 0) {
        in_stack_fffffffffffffcc7 = local_200.str == (char *)0x0;
      }
      local_28 = in_stack_fffffffffffffcb8;
      if (((in_stack_fffffffffffffcc7 ^ 0xff) & 1) != 0) goto LAB_003174dd;
      local_220 = _scan_to_next_nonempty_line
                            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
      local_30 = &local_220;
      in_stack_fffffffffffffcb7 = local_220.len == 0 || local_220.str == (char *)0x0;
      if ((bool)in_stack_fffffffffffffcb7) goto LAB_003174dd;
      local_138._176_8_ = local_220.str;
      local_138._184_8_ = local_220.len;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_238,(char (*) [3])0x348f96);
    pattern_01.str._7_1_ = in_stack_fffffffffffffcc7;
    pattern_01.str._0_7_ = in_stack_fffffffffffffcc0;
    pattern_01.len = (size_t)in_stack_fffffffffffffcc8;
    sVar3 = basic_substring<const_char>::find
                      (in_stack_fffffffffffffcb8,pattern_01,
                       CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
    if (sVar3 == 0xffffffffffffffff) {
      bVar1 = basic_substring<const_char>::ends_with
                        ((basic_substring<const_char> *)(local_138 + 0xb0),':');
      if (bVar1) {
        basic_substring<const_char>::find
                  ((basic_substring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   SUB41(in_stack_fffffffffffffc6c,3),0x3173dd);
        _line_progressed(in_stack_fffffffffffffd50,
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        bVar1 = is_debugger_attached();
        if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<66ul>
                  (local_268,
                   (char (*) [66])
                   "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars");
        _err<>(in_stack_00000130,in_stack_00000138);
      }
      else {
        basic_substring<char_const>::basic_substring<3ul>(local_278,(char (*) [3])" #");
        pattern_03.str._7_1_ = in_stack_fffffffffffffcc7;
        pattern_03.str._0_7_ = in_stack_fffffffffffffcc0;
        pattern_03.len = (size_t)in_stack_fffffffffffffcc8;
        local_228 = basic_substring<const_char>::find
                              (in_stack_fffffffffffffcb8,pattern_03,
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        if (local_228 != 0xffffffffffffffff) {
          _line_progressed(in_stack_fffffffffffffd50,
                           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          goto LAB_003174dd;
        }
      }
    }
    else {
      basic_substring<char_const>::basic_substring<3ul>(local_248,(char (*) [3])0x348f96);
      pattern_02.str._7_1_ = in_stack_fffffffffffffcc7;
      pattern_02.str._0_7_ = in_stack_fffffffffffffcc0;
      pattern_02.len = (size_t)in_stack_fffffffffffffcc8;
      basic_substring<const_char>::find
                (in_stack_fffffffffffffcb8,pattern_02,
                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      _line_progressed(in_stack_fffffffffffffd50,
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      bVar1 = is_debugger_attached();
      if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<66ul>
                (local_258,
                 (char (*) [66])
                 "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars");
      _err<>(in_stack_00000130,in_stack_00000138);
    }
    bVar1 = _advance_to_peeked((Parser *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (!bVar1) goto LAB_003174dd;
    local_138._176_8_ = *(undefined8 *)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_138._184_8_ = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
  } while( true );
}

Assistant:

substr Parser::_scan_plain_scalar_blck(csubstr currscalar, csubstr peeked_line, size_t indentation)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.begins_with(' ', indentation));
    while(true)
    {
        _c4dbgpf("rscalar[IMPL]: continuing... ref_indentation={}", indentation);
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rscalar[IMPL]: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else if(( ! peeked_line.begins_with(' ', indentation))) // is the line deindented?
        {
            if(!peeked_line.trim(" \r\n\t").empty()) // is the line not blank?
            {
                _c4dbgpf("rscalar[IMPL]: deindented line, not blank -- bail now '{}'", peeked_line.trimr("\r\n"));
                break;
            }
            _c4dbgpf("rscalar[IMPL]: line is blank and has less indentation: ref={} line={}: '{}'", indentation, peeked_line.first_not_of(' ') == csubstr::npos ? 0 : peeked_line.first_not_of(' '), peeked_line.trimr("\r\n"));
            _c4dbgpf("rscalar[IMPL]: ... searching for a line starting at indentation {}", indentation);
            csubstr next_peeked = _scan_to_next_nonempty_line(indentation);
            if(next_peeked.empty())
            {
                _c4dbgp("rscalar[IMPL]: ... finished.");
                break;
            }
            _c4dbgp("rscalar[IMPL]: ... continuing.");
            peeked_line = next_peeked;
        }

        _c4dbgpf("rscalar[IMPL]: line contents: '{}'", peeked_line.right_of(indentation, true).trimr("\r\n"));
        size_t token_pos;
        if(peeked_line.find(": ") != npos)
        {
            _line_progressed(peeked_line.find(": "));
            _c4err("': ' is not a valid token in plain flow (unquoted) scalars");
        }
        else if(peeked_line.ends_with(':'))
        {
            _line_progressed(peeked_line.find(':'));
            _c4err("lines cannot end with ':' in plain flow (unquoted) scalars");
        }
        else if((token_pos = peeked_line.find(" #")) != npos)
        {
            _line_progressed(token_pos);
            break;
            //_c4err("' #' is not a valid token in plain flow (unquoted) scalars");
        }

        _c4dbgpf("rscalar[IMPL]: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar[IMPL]: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    full = full.trimr("\r\n ");
    return full;
}